

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_portable.h
# Opt level: O2

void __thiscall
highwayhash::Portable::HHStatePortable::Update(HHStatePortable *this,HHPacket *packet)

{
  Lanes packet_lanes;
  
  CopyPartial(*packet,0x20,(char *)packet_lanes);
  Update(this,&packet_lanes);
  return;
}

Assistant:

HH_INLINE void Update(const HHPacket& packet) {
    Lanes packet_lanes;
    CopyPartial(&packet[0], sizeof(HHPacket),
                reinterpret_cast<char*>(&packet_lanes));
    for (int lane = 0; lane < kNumLanes; ++lane) {
      packet_lanes[lane] = host_from_le64(packet_lanes[lane]);
    }
    Update(packet_lanes);
  }